

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

BOOL __thiscall Js::DynamicObject::Freeze(DynamicObject *this)

{
  BOOL BVar1;
  Type *pTVar2;
  DynamicTypeHandler *this_00;
  Type *pTVar3;
  BOOL ret;
  Type *oldType;
  DynamicObject *this_local;
  
  pTVar2 = RecyclableObject::GetType(&this->super_RecyclableObject);
  this_00 = GetTypeHandler(this);
  BVar1 = DynamicTypeHandler::Freeze(this_00,this,false);
  pTVar3 = RecyclableObject::GetType(&this->super_RecyclableObject);
  if (pTVar3 == pTVar2) {
    ChangeType(this);
  }
  return BVar1;
}

Assistant:

BOOL DynamicObject::Freeze()
    {
        Type* oldType = this->GetType();
        BOOL ret = GetTypeHandler()->Freeze(this);

        // We just made all properties on this object non-writable.
        // Make sure the type is evolved so that the property string caches
        // are no longer hit.
        if (this->GetType() == oldType)
        {
            this->ChangeType();
        }

        return ret;
    }